

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  Btree *p;
  BtShared *pBVar1;
  Pager *pPVar2;
  sqlite3 *db_00;
  bool bVar3;
  int iVar4;
  _func_int_void_ptr *xBusy;
  Wal *pWal;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  lVar6 = 8;
  uVar5 = 0;
  iVar7 = 0;
  bVar3 = false;
  do {
    if ((iVar7 != 0) || ((long)db->nDb <= (long)uVar5)) {
      iVar4 = 5;
      if (!bVar3) {
        iVar4 = iVar7;
      }
      if (iVar7 != 0) {
        iVar4 = iVar7;
      }
      return iVar4;
    }
    iVar7 = 0;
    if (iDb == 0xc || (uint)iDb == uVar5) {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar6);
      if (p == (Btree *)0x0) {
        iVar4 = 0;
      }
      else {
        pBVar1 = p->pBt;
        sqlite3BtreeEnter(p);
        iVar4 = 6;
        if (pBVar1->inTransaction == '\0') {
          pPVar2 = pBVar1->pPager;
          db_00 = p->db;
          pWal = pPVar2->pWal;
          if (pWal == (Wal *)0x0) {
            iVar4 = 0;
            if (pPVar2->journalMode == '\x05') {
              iVar4 = 0;
              sqlite3_exec(db_00,"PRAGMA table_list",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0)
              ;
              pWal = pPVar2->pWal;
              if (pWal != (Wal *)0x0) goto LAB_00122d33;
            }
          }
          else {
LAB_00122d33:
            if (eMode == 0) {
              xBusy = (_func_int_void_ptr *)0x0;
            }
            else {
              xBusy = pPVar2->xBusyHandler;
            }
            iVar4 = sqlite3WalCheckpoint
                              (pWal,db_00,eMode,xBusy,pPVar2->pBusyHandlerArg,
                               (uint)pPVar2->walSyncFlags,(int)pPVar2->pageSize,
                               (u8 *)pPVar2->pTmpSpace,pnLog,pnCkpt);
          }
        }
        sqlite3BtreeLeave(p);
      }
      iVar7 = iVar4;
      if (iVar4 == 5) {
        iVar7 = 0;
      }
      if (iVar4 == 5) {
        bVar3 = true;
      }
      pnLog = (int *)0x0;
      pnCkpt = (int *)0x0;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x20;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );
  testcase( iDb==SQLITE_MAX_ATTACHED ); /* See forum post a006d86f72 */
  testcase( iDb==SQLITE_MAX_DB );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_DB ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}